

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O0

LO __thiscall Omega_h::Graph::nnodes(Graph *this)

{
  Graph *this_local;
  ulong local_10;
  
  if (((ulong)(this->a2ab).write_.shared_alloc_.alloc & 1) == 0) {
    local_10 = ((this->a2ab).write_.shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(this->a2ab).write_.shared_alloc_.alloc >> 3;
  }
  return (int)(local_10 >> 2) + -1;
}

Assistant:

LO Graph::nnodes() const { return a2ab.size() - 1; }